

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBaseCS::Run(BasicStdLayoutBaseCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  GLuint program;
  undefined4 extraout_var;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_d;
  stringstream ss;
  allocator_type local_1e9;
  void *local_1e8;
  void *pvStack_1e0;
  long local_1d8;
  string local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  char *__s;
  
  local_1e8 = (void *)0x0;
  pvStack_1e0 = (void *)0x0;
  local_1d8 = 0;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(local_size_x = 1) in;\n",0x1d);
  iVar2 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[9])(this,&local_1e8);
  __s = (char *)CONCAT44(extraout_var,iVar2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar3);
  }
  std::__cxx11::stringbuf::str();
  program = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_1c8);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar9 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,(long)pvStack_1e0 - (long)local_1e8,local_1e8,0x88e4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,
               (long)pvStack_1e0 - (long)local_1e8,&local_1e9);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,local_1c8._M_string_length - (long)local_1c8._M_dataplus._M_p,
               local_1c8._M_dataplus._M_p,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar4 = glu::CallLogWrapper::glMapBufferRange
                       (this_00,0x90d2,0,(long)pvStack_1e0 - (long)local_1e8,1);
    if (pvVar4 == (void *)0x0) {
      lVar9 = -1;
    }
    else {
      if (pvStack_1e0 == local_1e8) {
        uVar8 = 0;
      }
      else {
        bVar7 = 1;
        uVar8 = 0;
        pvVar5 = local_1e8;
        pvVar6 = pvStack_1e0;
        do {
          if (*(char *)((long)pvVar5 + uVar8) != *(char *)((long)pvVar4 + uVar8)) {
            anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar8 & 0xffffffff);
            bVar7 = 0;
            pvVar5 = local_1e8;
            pvVar6 = pvStack_1e0;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)pvVar6 - (long)pvVar5));
        uVar8 = (ulong)(~bVar7 & 1);
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      lVar9 = -uVar8;
    }
    if (local_1c8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      local_1c8.field_2._M_allocated_capacity - (long)local_1c8._M_dataplus._M_p);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  if (local_1e8 != (void *)0x0) {
    operator_delete(local_1e8,local_1d8 - (long)local_1e8);
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data;
		std::stringstream	ss;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);

		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &in_data[0], GL_STATIC_DRAW);
		std::vector<GLubyte> out_d(in_data.size());
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)out_d.size(), &out_d[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLubyte* out_data =
			(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data.size(), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;

		bool status = true;

		for (size_t i = 0; i < in_data.size(); ++i)
		{
			if (in_data[i] != out_data[i])
			{
				Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i], in_data[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!status)
			return ERROR;
		return NO_ERROR;
	}